

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max_operations.c
# Opt level: O3

size_t WebRtcSpl_MinIndexW32(int32_t *vector,size_t length)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  
  if (length == 0) {
    __assert_fail("length > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/min_max_operations.c"
                  ,0xd6,"size_t WebRtcSpl_MinIndexW32(const int32_t *, size_t)");
  }
  iVar2 = 0x7fffffff;
  sVar1 = 0;
  sVar3 = 0;
  do {
    if (vector[sVar3] < iVar2) {
      iVar2 = vector[sVar3];
      sVar1 = sVar3;
    }
    sVar3 = sVar3 + 1;
  } while (length != sVar3);
  return sVar1;
}

Assistant:

size_t WebRtcSpl_MinIndexW32(const int32_t* vector, size_t length) {
  size_t i = 0, index = 0;
  int32_t minimum = WEBRTC_SPL_WORD32_MAX;

  assert(length > 0);

  for (i = 0; i < length; i++) {
    if (vector[i] < minimum) {
      minimum = vector[i];
      index = i;
    }
  }

  return index;
}